

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void localfunc(LexState *ls,int defer)

{
  FuncState *fs;
  TString *pTVar1;
  LocVar *pLVar2;
  int iVar3;
  BlockCnt *pBVar4;
  int deferred;
  expdesc b;
  expdesc eStack_58;
  
  eStack_58.usertype = (TString *)0x0;
  eStack_58.k = VVOID;
  eStack_58._4_4_ = 0;
  eStack_58.u.ival = 0;
  eStack_58.u.ind.usertype = (TString *)0x0;
  eStack_58.t = 0;
  eStack_58.f = 0;
  eStack_58.ravi_type_map = 0xffffffff;
  eStack_58._36_4_ = 0;
  eStack_58.pc = -1;
  eStack_58._52_4_ = 0;
  fs = ls->fs;
  if (defer == 0) {
    pTVar1 = str_checkname(ls);
    new_localvar(ls,pTVar1,0x200,(TString *)0x0);
    adjustlocalvars((LexState *)ls->fs,1);
    iVar3 = ls->linenumber;
    deferred = 0;
  }
  else {
    pTVar1 = luaX_newstring(ls,"(deferred function)",0x13);
    new_localvar(ls,pTVar1,0x200,(TString *)0x0);
    pBVar4 = (BlockCnt *)&fs->bl;
    do {
      pBVar4 = pBVar4->previous;
    } while (fs->nactvar < pBVar4->nactvar);
    pBVar4->upval = '\x01';
    fs->bl->insidetbc = '\x01';
    adjustlocalvars((LexState *)ls->fs,1);
    iVar3 = ls->linenumber;
    deferred = 1;
  }
  body(ls,&eStack_58,0,iVar3,deferred);
  iVar3 = fs->pc;
  pLVar2 = getlocvar(fs,eStack_58.u.info);
  pLVar2->startpc = iVar3;
  return;
}

Assistant:

static void localfunc (LexState *ls, int defer) {
  expdesc b = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  FuncState *fs = ls->fs;
  if (defer) {
    static const char funcname[] = "(deferred function)";
    new_localvar(ls, luaX_newstring(ls, funcname, sizeof funcname-1), RAVI_TM_FUNCTION, NULL);  /* new local variable */
    markupval(fs, fs->nactvar);
    fs->bl->insidetbc = 1;  /* in the scope of a defer closure variable */
  } else {
    /* RAVI change - add type */
    new_localvar(ls, str_checkname(ls), RAVI_TM_FUNCTION, NULL);  /* new local variable */
  }
  adjustlocalvars(ls, 1);  /* enter its scope */
  body(ls, &b, 0, ls->linenumber, defer);  /* function created in next register */
  /* debug information will only see the variable after this point! */
  getlocvar(fs, b.u.info)->startpc = fs->pc;
}